

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_recv(CURL *curl,void *buffer,size_t buflen,size_t *n)

{
  CURLcode CVar1;
  curl_socket_t sfd;
  connectdata *c;
  ssize_t n1;
  curl_socket_t local_2c;
  connectdata *local_28;
  size_t local_20;
  
  CVar1 = easy_connection((SessionHandle *)curl,&local_2c,&local_28);
  if (CVar1 == CURLE_OK) {
    *n = 0;
    CVar1 = Curl_read(local_28,local_2c,(char *)buffer,buflen,(ssize_t *)&local_20);
    if (CVar1 == CURLE_OK) {
      *n = local_20;
      CVar1 = CURLE_OK;
    }
  }
  return CVar1;
}

Assistant:

CURLcode curl_easy_recv(CURL *curl, void *buffer, size_t buflen, size_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c;
  struct SessionHandle *data = (struct SessionHandle *)curl;

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  *n = 0;
  result = Curl_read(c, sfd, buffer, buflen, &n1);

  if(result)
    return result;

  *n = (size_t)n1;

  return CURLE_OK;
}